

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

FmsInt CompareScalarData(FmsScalarType stype,FmsInt size,void *lhs,void *rhs)

{
  FmsInt FVar1;
  double dVar2;
  double dVar3;
  float fVar4;
  
  if (lhs == rhs) {
    return 0;
  }
  if (rhs != (void *)0x0 && lhs != (void *)0x0) {
    switch(stype) {
    case FMS_FLOAT:
      FVar1 = 0;
      do {
        if (size == FVar1) {
          return 0;
        }
        fVar4 = *(float *)((long)lhs + FVar1 * 4) - *(float *)((long)rhs + FVar1 * 4);
        if (fVar4 < 0.0) {
          fVar4 = -fVar4;
        }
        FVar1 = FVar1 + 1;
      } while (fVar4 <= 1e-06);
      break;
    case FMS_DOUBLE:
      FVar1 = 0;
      do {
        if (size == FVar1) {
          return 0;
        }
        dVar2 = *(double *)((long)lhs + FVar1 * 8) - *(double *)((long)rhs + FVar1 * 8);
        dVar3 = -dVar2;
        if (-dVar2 <= dVar2) {
          dVar3 = dVar2;
        }
        FVar1 = FVar1 + 1;
      } while (dVar3 <= 1e-06);
      break;
    case FMS_COMPLEX_FLOAT:
      FVar1 = 0;
      do {
        if (size * 2 == FVar1) {
          return 0;
        }
        fVar4 = *(float *)((long)lhs + FVar1 * 4) - *(float *)((long)rhs + FVar1 * 4);
        if (fVar4 < 0.0) {
          fVar4 = -fVar4;
        }
        FVar1 = FVar1 + 1;
      } while (fVar4 <= 1e-06);
      break;
    case FMS_COMPLEX_DOUBLE:
      FVar1 = 0;
      do {
        if (size * 2 == FVar1) {
          return 0;
        }
        dVar2 = *(double *)((long)lhs + FVar1 * 8) - *(double *)((long)rhs + FVar1 * 8);
        dVar3 = -dVar2;
        if (-dVar2 <= dVar2) {
          dVar3 = dVar2;
        }
        FVar1 = FVar1 + 1;
      } while (dVar3 <= 1e-06);
      break;
    default:
      return 2;
    }
    return FVar1;
  }
  return 1;
}

Assistant:

static inline FmsInt CompareScalarData(FmsScalarType stype, FmsInt size,
                                       const void *lhs, const void *rhs) {
  if(lhs == rhs) return 0;
  if(!lhs) return 1;
  if(!rhs) return 1;
  FmsInt isDifferent = 0;
  switch(stype) {
  case FMS_FLOAT:
    COMPARE_SCALAR_DATA(float, lhs, rhs, size, isDifferent);
    break;
  case FMS_DOUBLE:
    COMPARE_SCALAR_DATA(double, lhs, rhs, size, isDifferent);
    break;
  case FMS_COMPLEX_FLOAT:
    COMPARE_SCALAR_DATA(float, lhs, rhs, size*2, isDifferent);
    break;
  case FMS_COMPLEX_DOUBLE:
    COMPARE_SCALAR_DATA(double, lhs, rhs, size*2, isDifferent);
    break;
  default:
    return 2;
  }
  return isDifferent;
}